

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O3

int Cudd_EquivDC(DdManager *dd,DdNode *F,DdNode *G,DdNode *D)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *g;
  int iVar3;
  uint uVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  uint uVar7;
  DdNode *G_00;
  DdNode *D_00;
  DdNode *F_00;
  uint uVar8;
  uint uVar9;
  DdNode *F_01;
  DdNode *f;
  DdNode *data;
  DdNode *local_48;
  
  pDVar2 = dd->one;
  uVar4 = 1;
  if (F != G && pDVar2 != D) {
    data = (DdNode *)((ulong)pDVar2 ^ 1);
    uVar4 = 0;
    if (((data != D) && ((DdNode *)((ulong)G ^ 1) != F)) && (dd->zero != D)) {
      pDVar5 = F;
      if (G < F) {
        pDVar5 = G;
        G = F;
      }
      f = (DdNode *)((ulong)pDVar5 & 0xfffffffffffffffe);
      g = (DdNode *)((ulong)G ^ 1);
      if (((ulong)pDVar5 & 1) == 0) {
        f = pDVar5;
        g = G;
      }
      pDVar5 = cuddCacheLookup(dd,0x4a,f,g,D);
      if (pDVar5 == (DdNode *)0x0) {
        uVar7 = 0x7fffffff;
        uVar4 = 0x7fffffff;
        if ((ulong)f->index != 0x7fffffff) {
          uVar4 = dd->perm[f->index];
        }
        pDVar5 = (DdNode *)((ulong)g & 0xfffffffffffffffe);
        if ((ulong)pDVar5->index != 0x7fffffff) {
          uVar7 = dd->perm[pDVar5->index];
        }
        uVar8 = uVar4;
        if (uVar7 < uVar4) {
          uVar8 = uVar7;
        }
        pDVar6 = (DdNode *)((ulong)D & 0xfffffffffffffffe);
        uVar1 = dd->perm[pDVar6->index];
        uVar9 = uVar8;
        if (uVar1 < uVar8) {
          uVar9 = uVar1;
        }
        F_00 = f;
        F_01 = f;
        if (uVar9 == uVar4) {
          F_00 = (f->type).kids.T;
          F_01 = (f->type).kids.E;
        }
        G_00 = g;
        local_48 = g;
        if (uVar9 == uVar7) {
          G_00 = (pDVar5->type).kids.T;
          local_48 = (pDVar5->type).kids.E;
          if (g != pDVar5) {
            G_00 = (DdNode *)((ulong)G_00 ^ 1);
            local_48 = (DdNode *)((ulong)local_48 ^ 1);
          }
        }
        pDVar5 = D;
        D_00 = D;
        if (uVar1 <= uVar8) {
          pDVar5 = (pDVar6->type).kids.T;
          D_00 = (pDVar6->type).kids.E;
          if (pDVar6 != D) {
            pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
            D_00 = (DdNode *)((ulong)D_00 ^ 1);
          }
        }
        iVar3 = Cudd_EquivDC(dd,F_00,G_00,pDVar5);
        if (iVar3 == 0) {
          uVar4 = 0;
        }
        else {
          uVar4 = Cudd_EquivDC(dd,F_01,local_48,D_00);
          if (uVar4 != 0) {
            data = pDVar2;
          }
        }
        cuddCacheInsert(dd,0x4a,f,g,D,data);
      }
      else {
        uVar4 = (uint)(pDVar5 == pDVar2);
      }
    }
  }
  return uVar4;
}

Assistant:

int
Cudd_EquivDC(
  DdManager * dd,
  DdNode * F,
  DdNode * G,
  DdNode * D)
{
    DdNode *tmp, *One, *Gr, *Dr;
    DdNode *Fv, *Fvn, *Gv, *Gvn, *Dv, *Dvn;
    int res;
    unsigned int flevel, glevel, dlevel, top;

    One = DD_ONE(dd);

    statLine(dd);
    /* Check terminal cases. */
    if (D == One || F == G) return(1);
    if (D == Cudd_Not(One) || D == DD_ZERO(dd) || F == Cudd_Not(G)) return(0);

    /* From now on, D is non-constant. */

    /* Normalize call to increase cache efficiency. */
    if (F > G) {
        tmp = F;
        F = G;
        G = tmp;
    }
    if (Cudd_IsComplement(F)) {
        F = Cudd_Not(F);
        G = Cudd_Not(G);
    }

    /* From now on, F is regular. */

    /* Check cache. */
    tmp = cuddCacheLookup(dd,DD_EQUIV_DC_TAG,F,G,D);
    if (tmp != NULL) return(tmp == One);

    /* Find splitting variable. */
    flevel = cuddI(dd,F->index);
    Gr = Cudd_Regular(G);
    glevel = cuddI(dd,Gr->index);
    top = ddMin(flevel,glevel);
    Dr = Cudd_Regular(D);
    dlevel = dd->perm[Dr->index];
    top = ddMin(top,dlevel);

    /* Compute cofactors. */
    if (top == flevel) {
        Fv = cuddT(F);
        Fvn = cuddE(F);
    } else {
        Fv = Fvn = F;
    }
    if (top == glevel) {
        Gv = cuddT(Gr);
        Gvn = cuddE(Gr);
        if (G != Gr) {
            Gv = Cudd_Not(Gv);
            Gvn = Cudd_Not(Gvn);
        }
    } else {
        Gv = Gvn = G;
    }
    if (top == dlevel) {
        Dv = cuddT(Dr);
        Dvn = cuddE(Dr);
        if (D != Dr) {
            Dv = Cudd_Not(Dv);
            Dvn = Cudd_Not(Dvn);
        }
    } else {
        Dv = Dvn = D;
    }

    /* Solve recursively. */
    res = Cudd_EquivDC(dd,Fv,Gv,Dv);
    if (res != 0) {
        res = Cudd_EquivDC(dd,Fvn,Gvn,Dvn);
    }
    cuddCacheInsert(dd,DD_EQUIV_DC_TAG,F,G,D,(res) ? One : Cudd_Not(One));

    return(res);

}